

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::ChFunction_Setpoint>::_create<chrono::ChFunction_Setpoint>
          (ChClassRegistration<chrono::ChFunction_Setpoint> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x38);
  *puVar1 = &PTR__ChFunction_011924f0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  return puVar1;
}

Assistant:

typename enable_if< std::is_default_constructible<Tc>::value, void* >::type
    _create() {
        return reinterpret_cast<void*>(new Tc);
    }